

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

int String::compare(char *s1,char *s2)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    bVar1 = s1[lVar2];
    if (bVar1 != s2[lVar2]) {
      return (uint)bVar1 - (uint)(byte)s2[lVar2];
    }
    if (bVar1 == 0) break;
    lVar2 = lVar2 + 1;
  }
  return 0;
}

Assistant:

static int compare(const char* s1, const char* s2)
  {
    for(; *s1 == *s2; ++s1, ++s2)
      if(!*s1)
        return 0;
    return (int)*(const uchar*)s1 - *(const uchar*)s2;
  }